

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

ByteData256 * cfd::core::HashUtil::Sha256D(ByteData256 *__return_storage_ptr__,ByteData160 *data)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_28;
  
  ByteData160::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_28,data);
  Sha256D(__return_storage_ptr__,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_28
         );
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_28);
  return __return_storage_ptr__;
}

Assistant:

ByteData256 HashUtil::Sha256D(const ByteData160 &data) {
  return Sha256D(data.GetBytes());
}